

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIFFImageHandler.cpp
# Opt level: O2

void __thiscall
TIFFImageHandler::WriteImageXObjectFilter
          (TIFFImageHandler *this,DictionaryContext *inImageDictionary,int inTileIndex)

{
  t2p_compress_t tVar1;
  int iVar2;
  bool bVar3;
  DictionaryContext *this_00;
  T2P_TILES *pTVar4;
  
  if (this->mT2p->pdf_compression == T2P_COMPRESS_NONE) {
    return;
  }
  DictionaryContext::WriteKey(inImageDictionary,&scFilter_abi_cxx11_);
  tVar1 = this->mT2p->pdf_compression;
  if (tVar1 == T2P_COMPRESS_ZIP) {
    DictionaryContext::WriteNameValue(inImageDictionary,&scFlateDecode_abi_cxx11_);
    if (this->mT2p->pdf_compressionquality % 100 == 0) {
      return;
    }
    DictionaryContext::WriteKey(inImageDictionary,&scDecodeParms_abi_cxx11_);
    this_00 = ObjectsContext::StartDictionary(this->mObjectsContext);
    DictionaryContext::WriteKey(this_00,&scPredictor_abi_cxx11_);
    DictionaryContext::WriteIntegerValue(this_00,(ulong)(this->mT2p->pdf_compressionquality % 100));
    DictionaryContext::WriteKey(this_00,&scColumns_abi_cxx11_);
    DictionaryContext::WriteIntegerValue(this_00,(ulong)this->mT2p->tiff_width);
    DictionaryContext::WriteKey(this_00,&scColors_abi_cxx11_);
    DictionaryContext::WriteIntegerValue(this_00,(ulong)this->mT2p->tiff_samplesperpixel);
    DictionaryContext::WriteKey(this_00,&scBitsPerComponent_abi_cxx11_);
    DictionaryContext::WriteIntegerValue(this_00,(ulong)this->mT2p->tiff_bitspersample);
  }
  else {
    if (tVar1 != T2P_COMPRESS_G4) {
      return;
    }
    DictionaryContext::WriteNameValue(inImageDictionary,&scCCITTFaxDecode_abi_cxx11_);
    DictionaryContext::WriteKey(inImageDictionary,&scDecodeParms_abi_cxx11_);
    this_00 = ObjectsContext::StartDictionary(this->mObjectsContext);
    DictionaryContext::WriteKey(this_00,&scK_abi_cxx11_);
    DictionaryContext::WriteIntegerValue(this_00,-1);
    iVar2 = *(int *)(this->mT2p->tiff_tiles + (ulong)this->mT2p->pdf_page * 0x28);
    DictionaryContext::WriteKey(this_00,&scColumns_abi_cxx11_);
    if (iVar2 == 0) {
      DictionaryContext::WriteIntegerValue(this_00,(ulong)this->mT2p->tiff_width);
      DictionaryContext::WriteKey(this_00,&scRows_abi_cxx11_);
      pTVar4 = (T2P_TILES *)&this->mT2p->tiff_length;
    }
    else {
      bVar3 = TileIsRightEdge(this,inTileIndex);
      DictionaryContext::WriteIntegerValue
                (this_00,(ulong)*(uint *)(this->mT2p->tiff_tiles +
                                         (ulong)bVar3 * 0x10 + 4 +
                                         (ulong)this->mT2p->pdf_page * 0x28));
      DictionaryContext::WriteKey(this_00,&scRows_abi_cxx11_);
      bVar3 = TileIsBottomEdge(this,inTileIndex);
      pTVar4 = this->mT2p->tiff_tiles + (ulong)bVar3 * 0x10 + (ulong)this->mT2p->pdf_page * 0x28 + 8
      ;
    }
    DictionaryContext::WriteIntegerValue(this_00,(ulong)*(uint *)pTVar4);
    if (this->mT2p->pdf_switchdecode == 0) {
      DictionaryContext::WriteKey(this_00,&scBlackIs1_abi_cxx11_);
      DictionaryContext::WriteBooleanValue(this_00,true);
    }
  }
  ObjectsContext::EndDictionary(this->mObjectsContext,this_00);
  return;
}

Assistant:

void TIFFImageHandler::WriteImageXObjectFilter(DictionaryContext* inImageDictionary,int inTileIndex)
{
	DictionaryContext* decodeParmsDictionary;

	if(mT2p->pdf_compression==T2P_COMPRESS_NONE)
		return;

	// Filter
	inImageDictionary->WriteKey(scFilter);


	switch(mT2p->pdf_compression)
	{
		case T2P_COMPRESS_G4:
			inImageDictionary->WriteNameValue(scCCITTFaxDecode);

			// DecodeParms
			inImageDictionary->WriteKey(scDecodeParms);
			decodeParmsDictionary = mObjectsContext->StartDictionary();

			// K
			decodeParmsDictionary->WriteKey(scK);
			decodeParmsDictionary->WriteIntegerValue(-1);

			if(0 == mT2p->tiff_tiles[mT2p->pdf_page].tiles_tilecount)
			{
				// Columns
				decodeParmsDictionary->WriteKey(scColumns);
				decodeParmsDictionary->WriteIntegerValue(mT2p->tiff_width);

				// Rows
				decodeParmsDictionary->WriteKey(scRows);
				decodeParmsDictionary->WriteIntegerValue(mT2p->tiff_length);
			}
			else
			{
				// Columns
				decodeParmsDictionary->WriteKey(scColumns);
				decodeParmsDictionary->WriteIntegerValue(
					TileIsRightEdge(inTileIndex) ? 
						mT2p->tiff_tiles[mT2p->pdf_page].tiles_edgetilewidth :
						mT2p->tiff_tiles[mT2p->pdf_page].tiles_tilewidth
					);
			
				// Rows
				decodeParmsDictionary->WriteKey(scRows);
				decodeParmsDictionary->WriteIntegerValue(
					TileIsBottomEdge(inTileIndex) ? 
						mT2p->tiff_tiles[mT2p->pdf_page].tiles_edgetilelength :
						mT2p->tiff_tiles[mT2p->pdf_page].tiles_tilelength
					);
			}

			if(mT2p->pdf_switchdecode == 0)
			{
				// BlackIs1
				decodeParmsDictionary->WriteKey(scBlackIs1);
				decodeParmsDictionary->WriteBooleanValue(true);
			}
			mObjectsContext->EndDictionary(decodeParmsDictionary);
			break;
		case T2P_COMPRESS_ZIP:
			inImageDictionary->WriteNameValue(scFlateDecode);

			if(mT2p->pdf_compressionquality%100)
			{
				// DecodeParms
				inImageDictionary->WriteKey(scDecodeParms);
				decodeParmsDictionary = mObjectsContext->StartDictionary();

				// Predictor
				decodeParmsDictionary->WriteKey(scPredictor);
				decodeParmsDictionary->WriteIntegerValue(mT2p->pdf_compressionquality%100);

				// Columns
				decodeParmsDictionary->WriteKey(scColumns);
				decodeParmsDictionary->WriteIntegerValue(mT2p->tiff_width);

				// Colors
				decodeParmsDictionary->WriteKey(scColors);
				decodeParmsDictionary->WriteIntegerValue(mT2p->tiff_samplesperpixel);

				// BitsPerComponent
				decodeParmsDictionary->WriteKey(scBitsPerComponent);
				decodeParmsDictionary->WriteIntegerValue(mT2p->tiff_bitspersample);

				mObjectsContext->EndDictionary(decodeParmsDictionary);
			}
			break;
        default:
            // do nothing
            break;
	}
}